

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaTrie.hpp
# Opt level: O0

void __thiscall
ddd::DaTrie<false,_true,_true>::DaTrie
          (DaTrie<false,_true,_true> *this,
          vector<const_char_*,_std::allocator<const_char_*>_> *prefixes)

{
  bool bVar1;
  uint32_t uVar2;
  reference pvVar3;
  reference ppcVar4;
  char *pcVar5;
  undefined8 in_RSI;
  vector<const_char_*,_std::allocator<const_char_*>_> *in_RDI;
  Query query;
  char *prefix;
  const_iterator __end2;
  const_iterator __begin2;
  vector<const_char_*,_std::allocator<const_char_*>_> *__range2;
  vector<const_char_*,_std::allocator<const_char_*>_> *__lhs;
  vector<const_char_*,_std::allocator<const_char_*>_> *blocks;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  DaTrie<false,_true,_true> *in_stack_ffffffffffffffa8;
  DaTrie<false,_true,_true> *in_stack_ffffffffffffffb0;
  __normal_iterator<const_char_*const_*,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
  local_30;
  undefined8 local_28;
  undefined8 local_10;
  
  blocks = in_RDI;
  local_10 = in_RSI;
  std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::vector
            ((vector<ddd::Bc,_std::allocator<ddd::Bc>_> *)0x194e8d);
  __lhs = blocks + 1;
  std::vector<char,_std::allocator<char>_>::vector((vector<char,_std::allocator<char>_> *)0x194ea0);
  uVar2 = (uint32_t)((ulong)(blocks + 2) >> 0x20);
  std::vector<ddd::Block,_std::allocator<ddd::Block>_>::vector
            ((vector<ddd::Block,_std::allocator<ddd::Block>_> *)0x194eb3);
  std::vector<ddd::NodeLink,_std::allocator<ddd::NodeLink>_>::vector
            ((vector<ddd::NodeLink,_std::allocator<ddd::NodeLink>_> *)0x194ec6);
  *(undefined4 *)
   &(((_Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_> *)
     &blocks[4].super__Vector_base<const_char_*,_std::allocator<const_char_*>_>)->_M_impl).
    super__Vector_impl_data._M_start = 0xffffffff;
  *(undefined4 *)
   ((long)&(((_Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_> *)
            &blocks[4].super__Vector_base<const_char_*,_std::allocator<const_char_*>_>)->_M_impl).
           super__Vector_impl_data._M_start + 4) = 0;
  *(undefined4 *)
   &(((_Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_> *)
     &blocks[4].super__Vector_base<const_char_*,_std::allocator<const_char_*>_>)->_M_impl).
    super__Vector_impl_data._M_finish = 0;
  fix_((DaTrie<false,_true,_true> *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
       uVar2,(vector<ddd::Block,_std::allocator<ddd::Block>_> *)blocks);
  pvVar3 = std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::operator[]
                     ((vector<ddd::Bc,_std::allocator<ddd::Bc>_> *)in_RDI,0);
  Bc::set_base(pvVar3,0x7fffffff);
  pvVar3 = std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::operator[]
                     ((vector<ddd::Bc,_std::allocator<ddd::Bc>_> *)in_RDI,0);
  Bc::set_check(pvVar3,0x7fffffff);
  local_28 = local_10;
  local_30._M_current =
       (char **)std::vector<const_char_*,_std::allocator<const_char_*>_>::begin(in_RDI);
  std::vector<const_char_*,_std::allocator<const_char_*>_>::end(in_RDI);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_char_*const_*,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
                             *)__lhs,(__normal_iterator<const_char_*const_*,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
                                      *)in_RDI), bVar1) {
    ppcVar4 = __gnu_cxx::
              __normal_iterator<const_char_*const_*,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
              ::operator*(&local_30);
    Query::Query((Query *)&stack0xffffffffffffffa8,*ppcVar4);
    search_prefix(in_stack_ffffffffffffffa8,
                  (Query *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
    pcVar5 = Query::key((Query *)&stack0xffffffffffffffa8);
    if (*pcVar5 == '\0') {
      in_stack_ffffffffffffffa4 = 3;
    }
    else {
      uVar2 = Query::node_pos((Query *)&stack0xffffffffffffffa8);
      pvVar3 = std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::operator[]
                         ((vector<ddd::Bc,_std::allocator<ddd::Bc>_> *)in_RDI,(ulong)uVar2);
      uVar2 = Bc::base(pvVar3);
      if (uVar2 != 0x7fffffff) {
        insert_edge_(in_stack_ffffffffffffffb0,(Query *)in_stack_ffffffffffffffa8);
      }
      while (pcVar5 = Query::key((Query *)&stack0xffffffffffffffa8), *pcVar5 != '\0') {
        append_edge_(in_stack_ffffffffffffffb0,(Query *)in_stack_ffffffffffffffa8);
      }
      uVar2 = Query::node_pos((Query *)&stack0xffffffffffffffa8);
      pvVar3 = std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::operator[]
                         ((vector<ddd::Bc,_std::allocator<ddd::Bc>_> *)in_RDI,(ulong)uVar2);
      Bc::set_base(pvVar3,0x7fffffff);
      in_stack_ffffffffffffffa4 = 0;
    }
    Query::~Query((Query *)&stack0xffffffffffffffa8);
    __gnu_cxx::
    __normal_iterator<const_char_*const_*,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
    ::operator++(&local_30);
  }
  return;
}

Assistant:

DaTrie(const std::vector<const char*>& prefixes) {
    assert(Prefix);

    fix_(ROOT_POS, blocks_);
    bc_[ROOT_POS].set_base(INVALID_VALUE);
    bc_[ROOT_POS].set_check(INVALID_VALUE);

    for (auto prefix : prefixes) {
      Query query(prefix);
      search_prefix(query);
      if (*query.key() == '\0') {
        continue;
      }
      if (bc_[query.node_pos()].base() != INVALID_VALUE) {
        insert_edge_(query);
      }
      while (*query.key() != '\0') {
        append_edge_(query);
      }
      bc_[query.node_pos()].set_base(INVALID_VALUE);
    }
  }